

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

Entry * __thiscall
cali::Caliper::get(Entry *__return_storage_ptr__,Caliper *this,ChannelBody *chB,Attribute *attr)

{
  siglock *psVar1;
  ThreadData *pTVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  cali_id_t cVar7;
  cali_id_t cVar8;
  Entry local_48;
  
  if (attr->m_node == (Node *)0x0) {
    cVar8 = 0xffffffffffffffff;
  }
  else {
    cVar8 = attr->m_node->m_id;
  }
  uVar3 = Attribute::properties(attr);
  cVar7 = (ulong)((uVar3 >> 10 & 1) != 0) + 1;
  if ((uVar3 & 1) != 0) {
    cVar7 = cVar8;
  }
  pTVar2 = this->sT;
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + 1;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&chB->channel_blackboard_lock);
  uVar6 = cVar7;
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  do {
    uVar5 = (ulong)(uint)(((int)uVar6 + (int)(uVar6 / 0x3fd) * -0x3fd) * 0x20);
    cVar8 = *(cali_id_t *)((long)&(chB->channel_blackboard).hashtable[0].key + uVar5);
    if (cVar8 == cVar7) break;
    uVar6 = uVar6 % 0x3fd + 1;
  } while (cVar8 != 0xffffffffffffffff);
  if (cVar8 == cVar7) {
    local_48.m_value.m_v.value =
         *(anon_union_8_7_33918203_for_value *)
          ((long)&(chB->channel_blackboard).hashtable[0].value.m_value.m_v.value + uVar5);
    local_48.m_node = *(Node **)((long)&(chB->channel_blackboard).hashtable[0].value.m_node + uVar5)
    ;
    local_48.m_value.m_v.type_and_size =
         *(uint64_t *)
          ((long)&(chB->channel_blackboard).hashtable[0].value.m_value.m_v.type_and_size + uVar5);
  }
  else {
    local_48.m_node = (Node *)0x0;
    local_48.m_value.m_v.type_and_size = 0;
    local_48.m_value.m_v.value.v_uint = 0;
  }
  Entry::get(__return_storage_ptr__,&local_48,attr);
  pthread_mutex_unlock((pthread_mutex_t *)&chB->channel_blackboard_lock);
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + -1;
  return __return_storage_ptr__;
}

Assistant:

Entry Caliper::get(ChannelBody* chB, const Attribute& attr)
{
    cali_id_t key = get_blackboard_key(attr.id(), attr.properties());

    std::lock_guard<::siglock> g(sT->lock);
    std::lock_guard<std::mutex> gbb(chB->channel_blackboard_lock);

    return chB->channel_blackboard.get(key).get(attr);
}